

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O1

void __thiscall t_html_generator::generate_const(t_html_generator *this,t_const *tconst)

{
  ofstream_with_content_based_conditional_update *poVar1;
  pointer pcVar2;
  ostream *poVar3;
  string name;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  pcVar2 = (tconst->name_)._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (tconst->name_)._M_string_length);
  poVar1 = &this->f_out_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"<tr id=\"Const_",0xe);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"><td><code>",0xc);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</code></td><td>",0x10);
  print_type(this,tconst->type_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</td><td><code>",0xf);
  print_const_value(this,tconst->type_,tconst->value_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</code></td></tr>",0x11);
  if ((tconst->super_t_doc).has_doc_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"<tr><td colspan=\"3\"><blockquote>",0x20);
    print_doc(this,&tconst->super_t_doc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"</blockquote></td></tr>",0x17);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void t_html_generator::generate_const(t_const* tconst) {
  string name = tconst->get_name();
  f_out_ << "<tr id=\"Const_" << name << "\"><td><code>" << name << "</code></td><td>";
  print_type(tconst->get_type());
  f_out_ << "</td><td><code>";
  print_const_value(tconst->get_type(), tconst->get_value());
  f_out_ << "</code></td></tr>";
  if (tconst->has_doc()) {
    f_out_ << "<tr><td colspan=\"3\"><blockquote>";
    print_doc(tconst);
    f_out_ << "</blockquote></td></tr>";
  }
}